

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Message(string *m,char *title)

{
  bool bVar1;
  ostream *this;
  void *this_00;
  char *title_local;
  string *m_local;
  
  if (!s_DisableMessages) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_);
    if (bVar1) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
                    *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_,m,title);
    }
    else {
      this = std::operator<<((ostream *)&std::cerr,(string *)m);
      this_00 = (void *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void cmSystemTools::Message(const std::string& m, const char* title)
{
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback) {
    s_MessageCallback(m, title);
    return;
  }
  std::cerr << m << std::endl << std::flush;
}